

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_hash.c
# Opt level: O1

void ascon_hash_cleanup(ascon_hash_ctx_t *ctx)

{
  uint_fast8_t i;
  long lVar1;
  
  lVar1 = 0;
  (ctx->sponge).x0 = 0;
  (ctx->sponge).x1 = 0;
  (ctx->sponge).x2 = 0;
  (ctx->sponge).x3 = 0;
  (ctx->sponge).x4 = 0;
  do {
    ctx->buffer[lVar1] = '\0';
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  lVar1 = 0;
  ctx->buffer_len = '\0';
  ctx->flow_state = '\0';
  do {
    ctx->pad[lVar1] = '\0';
    lVar1 = lVar1 + 1;
  } while (lVar1 != 6);
  return;
}

Assistant:

ASCON_API void
ascon_hash_cleanup(ascon_hash_ctx_t* const ctx)
{
    ASCON_ASSERT(ctx != NULL);
    // Manual cleanup using volatile pointers to have more assurance the
    // cleanup will not be removed by the optimiser.
    ((volatile ascon_hash_ctx_t*) ctx)->sponge.x0 = 0U;
    ((volatile ascon_hash_ctx_t*) ctx)->sponge.x1 = 0U;
    ((volatile ascon_hash_ctx_t*) ctx)->sponge.x2 = 0U;
    ((volatile ascon_hash_ctx_t*) ctx)->sponge.x3 = 0U;
    ((volatile ascon_hash_ctx_t*) ctx)->sponge.x4 = 0U;
    for (uint_fast8_t i = 0; i < ASCON_DOUBLE_RATE; i++)
    {
        ((volatile ascon_aead_ctx_t*) ctx)->bufstate.buffer[i] = 0U;
    }
    ((volatile ascon_hash_ctx_t*) ctx)->buffer_len = 0U;
    ((volatile ascon_hash_ctx_t*) ctx)->flow_state = ASCON_FLOW_CLEANED;
    // Clearing also the padding to set the whole context to be all-zeros.
    // Makes it easier to check for initialisation and provides a known
    // state after cleanup, initialising all memory.
    for (uint_fast8_t i = 0U; i < 6U; i++)
    {
        ((volatile ascon_aead_ctx_t*) ctx)->bufstate.pad[i] = 0U;
    }
}